

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form8_Threshold(ThresholdDoubleForm4 Threshold)

{
  anon_class_8_1_a814987b __f;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  byte *pbVar7;
  code *in_RDI;
  uint uVar8;
  uint8_t maxThreshold;
  uint8_t minThreshold;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_fffffffffffffe78;
  uint32_t in_stack_fffffffffffffe7c;
  uint32_t in_stack_fffffffffffffe80;
  undefined2 in_stack_fffffffffffffe84;
  uchar in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe94;
  size_type sVar9;
  uint8_t value;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  Image *image_00;
  uint32_t *in_stack_fffffffffffffee0;
  uint32_t *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  value_type vVar10;
  undefined4 in_stack_fffffffffffffef4;
  value_type vVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  value_type vVar12;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined1 local_b0 [48];
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_80;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_68;
  uchar *local_60;
  uchar *local_58;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  code *local_20;
  
  local_20 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffe7c);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            *)0x1e56e2);
  local_58 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_60 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  __first._M_current._4_4_ = in_stack_fffffffffffffe8c;
  __first._M_current._0_4_ = in_stack_fffffffffffffe88;
  __last._M_current._4_2_ = in_stack_fffffffffffffe84;
  __last._M_current._0_4_ = in_stack_fffffffffffffe80;
  __last._M_current._6_1_ = in_stack_fffffffffffffe86;
  __last._M_current._7_1_ = in_stack_fffffffffffffe87;
  __f.image._4_4_ = in_stack_fffffffffffffe7c;
  __f.image._0_4_ = in_stack_fffffffffffffe78;
  local_68 = &local_50;
  local_80 = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)std::
                for_each<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,Function_Template::form8_Threshold(void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_char,unsigned_char))::__0>
                          (__first,__last,__f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1e576b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1e5780);
  Unit_Test::generateRoi
            ((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
             ,in_stack_fffffffffffffee0);
  bVar1 = Test_Helper::randomValue<unsigned_char>(0x1e57b9);
  bVar2 = Test_Helper::randomValue<unsigned_char>
                    (in_stack_fffffffffffffe86,in_stack_fffffffffffffe80);
  sVar9 = 0;
  this = &local_50;
  pvVar4 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,0);
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_b0 + 0x18);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,sVar9);
  vVar10 = *pvVar5;
  image_00 = (Image *)local_b0;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)image_00,sVar9);
  value = (uint8_t)(sVar9 >> 0x38);
  vVar11 = *pvVar5;
  sVar9 = 1;
  pvVar6 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,1);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,sVar9);
  vVar12 = *pvVar5;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)image_00,sVar9);
  uVar8 = (uint)bVar2;
  (*local_20)(pvVar4,vVar10,vVar11,pvVar6,vVar12,*pvVar5,local_b4,local_b8,bVar1);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](&local_50,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_b0 + 0x18),1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,1);
  pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0);
  if (bVar1 <= *pbVar7) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0);
  }
  bVar3 = Unit_Test::verifyImage
                    (image_00,(uint32_t)((ulong)this_00 >> 0x20),(uint32_t)this_00,
                     (uint32_t)((ulong)this >> 0x20),(uint32_t)this,value);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe94,uVar8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe94,uVar8));
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)CONCAT44(in_stack_fffffffffffffe94,uVar8));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe94,uVar8));
  return bVar3;
}

Assistant:

bool form8_Threshold(ThresholdDoubleForm4 Threshold)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > image;

        std::for_each( intensity.begin(), intensity.end(), [&]( uint8_t value )
        { image.push_back( uniformImage( value ) ); } );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        const uint8_t minThreshold = randomValue <uint8_t>( 255 );
        const uint8_t maxThreshold = randomValue <uint8_t>( minThreshold, 255 );

        Threshold( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], roiWidth, roiHeight, minThreshold, maxThreshold );

        return verifyImage( image[1], roiX[1], roiY[1], roiWidth, roiHeight,
                          intensity[0] < minThreshold || intensity[0] > maxThreshold ? 0 : 255 );
    }